

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O3

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  DataType *pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar2;
  ulong __n;
  int iVar3;
  Object *pOVar4;
  long lVar5;
  IfcPresentationStyleAssignment *pIVar6;
  _Rb_tree_header *p_Var7;
  aiMaterial *paVar8;
  char *__src;
  IfcSurfaceStyleShading *pIVar9;
  IfcColourRgb *in;
  long *plVar10;
  aiMaterial *paVar11;
  mapped_type_conflict3 *pmVar12;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var13;
  undefined7 in_register_00000009;
  undefined8 *puVar14;
  _Base_ptr p_Var15;
  size_type *psVar16;
  uint uVar17;
  ulong unaff_RBX;
  pointer psVar18;
  pointer ppaVar19;
  undefined4 in_register_00000034;
  _Base_ptr p_Var20;
  IfcSurfaceStyle *pIVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 *puVar22;
  undefined4 uVar23;
  pointer __p;
  bool bVar24;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar25;
  aiColor4D col;
  int shading;
  IfcSurfaceStyle *surf;
  string side;
  aiColor4D col_base;
  float t;
  aiString name;
  aiColor4D local_958;
  aiMaterial *local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  undefined4 local_918;
  undefined4 local_914;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_910;
  _Rb_tree_header *local_908;
  IfcSurfaceStyle *local_900;
  ulong local_8f8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_8f0;
  undefined8 *local_8e8;
  _Base_ptr local_8e0;
  undefined8 *local_8d8;
  MaterialCache *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  IfcSurfaceStyle *local_8b8;
  pointer local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  aiColor4D local_868;
  uint64_t local_850;
  undefined1 local_848 [112];
  ios_base local_7d8 [928];
  aiString local_438;
  
  local_8f8 = CONCAT44(in_register_00000034,prevMatId);
  local_918 = (undefined4)CONCAT71(in_register_00000009,forceDefaultMat);
  local_850 = id;
  pVar25 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(&(conv->db->refs)._M_t,&local_850);
  local_8f0 = pVar25.second._M_node;
  if (pVar25.first._M_node._M_node != local_8f0._M_node) {
    local_8d0 = &conv->cached_materials;
    local_908 = &(conv->cached_materials)._M_t._M_impl.super__Rb_tree_header;
    local_910 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials;
    do {
      local_8f0 = pVar25.second._M_node;
      local_8e0 = (_Base_ptr)pVar25.first._M_node;
      p_Var15 = (conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var20 = &(conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        bVar24 = *(_Base_ptr *)(p_Var15 + 1) < local_8e0[1]._M_parent;
        if (!bVar24) {
          p_Var20 = p_Var15;
        }
        p_Var15 = (&p_Var15->_M_left)[bVar24];
      } while (p_Var15 != (_Base_ptr)0x0);
      pOVar4 = STEP::LazyObject::operator*((LazyObject *)p_Var20[1]._M_parent);
      lVar5 = __dynamic_cast(pOVar4,&STEP::Object::typeinfo,&Schema_2x3::IfcStyledItem::typeinfo,
                             0xffffffffffffffff);
      if (lVar5 != 0) {
        puVar14 = *(undefined8 **)(lVar5 + 0x30);
        local_8e8 = *(undefined8 **)(lVar5 + 0x38);
        if (puVar14 != local_8e8) {
          do {
            local_8d8 = puVar14;
            pIVar6 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>
                               ((LazyObject *)*puVar14);
            puVar14 = *(undefined8 **)
                       &(pIVar6->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x10;
            puVar22 = *(undefined8 **)
                       &(pIVar6->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x18;
            local_8c8 = puVar22;
            if (puVar14 != puVar22) {
              do {
                pDVar1 = (DataType *)*puVar14;
                this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar14[1];
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                local_900 = STEP::EXPRESS::DataType::
                            ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>
                                      (pDVar1,conv->db);
                pIVar21 = local_900;
                if (local_900 != (IfcSurfaceStyle *)0x0) {
                  p_Var15 = (conv->cached_materials)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                  p_Var7 = local_908;
                  if (p_Var15 != (_Base_ptr)0x0) {
                    do {
                      if (*(IfcSurfaceStyle **)(p_Var15 + 1) >= local_900) {
                        p_Var7 = (_Rb_tree_header *)p_Var15;
                      }
                      p_Var15 = (&p_Var15->_M_left)[*(IfcSurfaceStyle **)(p_Var15 + 1) < local_900];
                    } while (p_Var15 != (_Base_ptr)0x0);
                    if ((p_Var7 != local_908) &&
                       ((IfcSurfaceStyle *)p_Var7->_M_node_count <= local_900)) {
                      unaff_RBX = (ulong)*(uint *)(p_Var7 + 1);
                      goto LAB_005a5ef2;
                    }
                  }
                  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
                  lVar5 = *(long *)&(local_900->super_IfcPresentationStyle).field_0x48;
                  local_8b8 = local_900;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_888,lVar5,*(long *)&local_900->field_0x50 + lVar5);
                  iVar3 = std::__cxx11::string::compare((char *)&local_888);
                  if (iVar3 != 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_848,
                                   "ignoring surface side marker on IFC::IfcSurfaceStyle: ",
                                   &local_888);
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_438,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_848);
                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&local_438);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                    std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
                    if ((undefined1 *)local_848._0_8_ != local_848 + 0x10) {
                      operator_delete((void *)local_848._0_8_);
                    }
                  }
                  paVar8 = (aiMaterial *)operator_new(0x10);
                  aiMaterial::aiMaterial(paVar8);
                  pIVar21 = local_900;
                  local_438.length = 0;
                  local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
                  local_940 = paVar8;
                  memset(local_438.data + 1,0x1b,0x3ff);
                  local_848._0_8_ = local_848 + 0x10;
                  local_8c0 = puVar14;
                  if ((pIVar21->super_IfcPresentationStyle).field_0x30 == '\x01') {
                    lVar5 = *(long *)&(pIVar21->super_IfcPresentationStyle).
                                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                      .field_0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_848,lVar5,
                               *(long *)&(pIVar21->super_IfcPresentationStyle).
                                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                         .field_0x18 + lVar5);
                    __src = (char *)local_848._0_8_;
                  }
                  else {
                    local_938._M_dataplus._M_p = (pointer)0x17;
                    __src = (char *)std::__cxx11::string::_M_create
                                              ((ulong *)local_848,(ulong)&local_938);
                    local_848._16_8_ = local_938._M_dataplus._M_p;
                    builtin_strncpy(__src,"IfcSurfaceStyle_Unnamed",0x17);
                    local_848._8_4_ = SUB84(local_938._M_dataplus._M_p,0);
                    local_848._12_4_ = (undefined4)((ulong)local_938._M_dataplus._M_p >> 0x20);
                    __src[(long)local_938._M_dataplus._M_p] = '\0';
                  }
                  __n = CONCAT44(local_848._12_4_,local_848._8_4_);
                  local_848._0_8_ = __src;
                  if (__n < 0x400) {
                    local_438.length = local_848._8_4_;
                    memcpy(local_438.data,__src,__n);
                    local_438.data[__n] = '\0';
                  }
                  if (__src != local_848 + 0x10) {
                    operator_delete(__src);
                  }
                  aiMaterial::AddProperty(paVar8,&local_438,"?mat.name",0,0);
                  psVar18 = (pIVar21->Styles).
                            super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            .
                            super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_8b0 = (pIVar21->Styles).
                              super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              .
                              super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  paVar11 = paVar8;
                  if (psVar18 != local_8b0) {
                    do {
                      pDVar1 = (psVar18->
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                      this_00 = (psVar18->
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                        }
                      }
                      pIVar9 = STEP::EXPRESS::DataType::
                               ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                                         (pDVar1,conv->db);
                      if (pIVar9 != (IfcSurfaceStyleShading *)0x0) {
                        local_868.r = 0.0;
                        local_868.g = 0.0;
                        local_868.b = 0.0;
                        local_868.a = 0.0;
                        local_958.r = 0.0;
                        local_958.g = 0.0;
                        local_958.b = 0.0;
                        local_958.a = 0.0;
                        in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcColourRgb>
                                       (*(LazyObject **)
                                         &(pIVar9->
                                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                          ).field_0x10);
                        ConvertColor(&local_868,in);
                        aiMaterial::AddBinaryProperty
                                  (paVar8,&local_868,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                        lVar5 = __dynamic_cast((_func_int *)
                                               ((long)&(pIVar9->
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper +
                                               (long)(pIVar9->
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                                               &Schema_2x3::IfcSurfaceStyleRendering::typeinfo,
                                               0xffffffffffffffff);
                        if (lVar5 != 0) {
                          if (*(char *)(lVar5 + 0x30) == '\x01') {
                            local_848._0_4_ = 1.0 - (float)*(double *)(lVar5 + 0x28);
                            aiMaterial::AddBinaryProperty
                                      (paVar8,local_848,4,"$mat.opacity",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar5 + 0x48) == '\x01') {
                            ConvertColor(&local_958,*(IfcColourOrFactor **)(lVar5 + 0x38),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      (paVar8,&local_958,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar5 + 0xa8) == '\x01') {
                            ConvertColor(&local_958,*(IfcColourOrFactor **)(lVar5 + 0x98),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      (paVar8,&local_958,0x10,"$clr.specular",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar5 + 0x60) == '\x01') {
                            ConvertColor(&local_958,*(IfcColourOrFactor **)(lVar5 + 0x50),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      (paVar8,&local_958,0x10,"$clr.transparent",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar5 + 0x90) == '\x01') {
                            ConvertColor(&local_958,*(IfcColourOrFactor **)(lVar5 + 0x80),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      (paVar8,&local_958,0x10,"$clr.reflective",0,0,aiPTI_Float);
                          }
                          uVar23 = 2;
                          if ((*(char *)(lVar5 + 0xc0) == '\x01') &&
                             (*(char *)(lVar5 + 0xa8) == '\x01')) {
                            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar5 + 200);
                            iVar3 = std::__cxx11::string::compare((char *)__rhs);
                            if (iVar3 == 0) {
                              uVar23 = 4;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)__rhs);
                              uVar23 = 9;
                              if (iVar3 != 0) {
                                iVar3 = std::__cxx11::string::compare((char *)__rhs);
                                if (iVar3 != 0) {
                                  iVar3 = std::__cxx11::string::compare((char *)__rhs);
                                  uVar23 = 3;
                                  if (iVar3 != 0) {
                                    std::operator+(&local_8a8,"shading mode ",__rhs);
                                    plVar10 = (long *)std::__cxx11::string::append
                                                                ((char *)&local_8a8);
                                    local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                                    psVar16 = (size_type *)(plVar10 + 2);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar10 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar16) {
                                      local_938.field_2._M_allocated_capacity = *psVar16;
                                      local_938.field_2._8_8_ = plVar10[3];
                                    }
                                    else {
                                      local_938.field_2._M_allocated_capacity = *psVar16;
                                      local_938._M_dataplus._M_p = (pointer)*plVar10;
                                    }
                                    local_938._M_string_length = plVar10[1];
                                    *plVar10 = (long)psVar16;
                                    plVar10[1] = 0;
                                    *(undefined1 *)(plVar10 + 2) = 0;
                                    Formatter::
                                    basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    ::basic_formatter<std::__cxx11::string>
                                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                                *)local_848,&local_938);
                                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_848);
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_848);
                                    std::ios_base::~ios_base(local_7d8);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_938._M_dataplus._M_p != &local_938.field_2) {
                                      operator_delete(local_938._M_dataplus._M_p);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
                                      operator_delete(local_8a8._M_dataplus._M_p);
                                    }
                                  }
                                }
                              }
                            }
                          }
                          local_914 = uVar23;
                          aiMaterial::AddBinaryProperty
                                    (paVar8,&local_914,4,"$mat.shadingm",0,0,aiPTI_Integer);
                          if (*(char *)(lVar5 + 0xc0) == '\x01') {
                            lVar5 = __dynamic_cast(*(undefined8 *)(lVar5 + 0xb0),
                                                   &STEP::EXPRESS::DataType::typeinfo,
                                                   &STEP::EXPRESS::PrimitiveDataType<double>::
                                                    typeinfo,0);
                            if (lVar5 == 0) {
                              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5a5e14);
                            }
                            else {
                              local_848._0_4_ = (undefined4)*(double *)(lVar5 + 8);
                              aiMaterial::AddBinaryProperty
                                        (paVar8,local_848,4,"$mat.shininess",0,0,aiPTI_Float);
                            }
                          }
                        }
                      }
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                      }
                      psVar18 = psVar18 + 1;
                      paVar11 = local_940;
                    } while (psVar18 != local_8b0);
                  }
                  puVar14 = local_8c0;
                  puVar22 = local_8c8;
                  local_940 = (aiMaterial *)0x0;
                  local_438.length = (ai_uint32)paVar11;
                  local_438.data._0_4_ = SUB84((ulong)paVar11 >> 0x20,0);
                  iVar2._M_current =
                       (conv->materials).
                       super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (conv->materials).
                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
                    _M_realloc_insert<aiMaterial*>(local_910,iVar2,(aiMaterial **)&local_438);
                    ppaVar19 = (conv->materials).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    *iVar2._M_current = paVar11;
                    ppaVar19 = (conv->materials).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                    (conv->materials).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_finish = ppaVar19;
                  }
                  lVar5 = *(long *)local_910;
                  pmVar12 = std::
                            map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                            ::operator[](local_8d0,&local_900);
                  uVar17 = (int)((ulong)((long)ppaVar19 - lVar5) >> 3) - 1;
                  unaff_RBX = (ulong)uVar17;
                  *pmVar12 = uVar17;
                  pIVar21 = local_8b8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_888._M_dataplus._M_p != &local_888.field_2) {
                    operator_delete(local_888._M_dataplus._M_p);
                    pIVar21 = local_8b8;
                  }
                }
LAB_005a5ef2:
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                }
                if (pIVar21 != (IfcSurfaceStyle *)0x0) goto LAB_005a613b;
                puVar14 = puVar14 + 2;
              } while (puVar14 != puVar22);
            }
            puVar14 = local_8d8 + 1;
          } while (puVar14 != local_8e8);
        }
      }
      _Var13._M_node = (_Base_ptr)std::_Rb_tree_increment(local_8e0);
      pVar25.second._M_node = local_8f0._M_node;
      pVar25.first._M_node = _Var13._M_node;
    } while (_Var13._M_node != local_8f0._M_node);
  }
  unaff_RBX = local_8f8;
  if ((char)local_918 == '\x01' && (int)local_8f8 == -1) {
    memset(local_438.data + 0xd,0x1b,0x3f3);
    local_438.length = 0xc;
    builtin_strncpy(local_438.data,"<IFCDefault>",0xd);
    ppaVar19 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppaVar19) {
      unaff_RBX = 0;
      do {
        local_848._0_4_ = 0;
        local_848._4_4_ = local_848._4_4_ & 0xffffff00;
        memset(local_848 + 5,0x1b,0x3ff);
        aiGetMaterialString(ppaVar19[unaff_RBX],"?mat.name",0,0,(aiString *)local_848);
        if ((local_848._0_4_ == 0xc) &&
           (local_438.data._8_4_ == local_848._12_4_ &&
            CONCAT44(local_438.data._4_4_,local_438.data._0_4_) ==
            CONCAT44(local_848._8_4_,local_848._4_4_))) goto LAB_005a613b;
        unaff_RBX = unaff_RBX + 1;
        ppaVar19 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (unaff_RBX <
               (ulong)((long)(conv->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppaVar19 >> 3));
    }
    paVar8 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar8);
    local_938._M_dataplus._M_p = (pointer)paVar8;
    aiMaterial::AddProperty(paVar8,&local_438,"?mat.name",0,0);
    local_848._0_4_ = 0x3f19999a;
    local_848[4] = -0x66;
    local_848[5] = -0x67;
    local_848[6] = '\x19';
    local_848[7] = '?';
    local_848[8] = -0x66;
    local_848[9] = -0x67;
    local_848[10] = '\x19';
    local_848[0xb] = '?';
    local_848[0xc] = '\0';
    local_848[0xd] = '\0';
    local_848[0xe] = -0x80;
    local_848[0xf] = '?';
    aiMaterial::AddBinaryProperty(paVar8,local_848,0x10,"$clr.diffuse",0,0,aiPTI_Float);
    local_938._M_dataplus._M_p = (pointer)0x0;
    iVar2._M_current =
         (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8a8._M_dataplus._M_p = (pointer)paVar8;
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,iVar2,
                 (aiMaterial **)&local_8a8);
      ppaVar19 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = paVar8;
      ppaVar19 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
      (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppaVar19;
    }
    unaff_RBX = (ulong)((int)((ulong)((long)ppaVar19 -
                                     (long)(conv->materials).
                                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  }
LAB_005a613b:
  return (uint)unaff_RBX;
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}